

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-unwrap.cpp
# Opt level: O1

CommandOptions * read_timed_text_file(CommandOptions *Options,IFileReaderFactory *fileReaderFactory)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  _List_node_base *p_Var9;
  MDD_t MVar10;
  int iVar11;
  long *plVar12;
  undefined8 uVar13;
  char *pcVar14;
  IFileReaderFactory *in_RDX;
  _Self __tmp;
  _List_node_base *p_Var15;
  long lVar16;
  MXFReader Reader;
  ui32_t write_count;
  TimedTextDescriptor *tt_descriptor;
  string XMLDoc;
  FileWriter Writer;
  string out_path;
  FrameBuffer FrameBuffer;
  TimedTextDescriptor TDesc;
  char buf [64];
  allocator<char> local_3ba;
  allocator<char> local_3b9;
  long *local_3b8 [2];
  long local_3a8 [2];
  undefined1 local_398 [24];
  undefined **local_380;
  undefined1 local_378;
  uchar local_377 [7];
  byte_t bStack_370;
  byte_t abStack_36f [7];
  byte_t bStack_368;
  _Alloc_hider local_360;
  undefined8 *local_358 [2];
  undefined8 local_348 [11];
  uint *local_2f0;
  undefined8 local_2e8;
  undefined1 local_2e0;
  undefined7 uStack_2df;
  undefined **local_2d0;
  undefined1 local_2c8;
  _List_node_base *local_2c7;
  _List_node_base *p_Stack_2bf;
  long *local_298 [2];
  long local_288 [2];
  long *local_278 [2];
  long local_268 [2];
  undefined **local_258;
  undefined1 local_250;
  _List_node_base *local_24f;
  _List_node_base *p_Stack_247;
  undefined1 local_238 [120];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  _List_node_base local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  allocator<char> local_148 [72];
  Result_t local_100 [104];
  Result_t local_98 [104];
  
  AS_02::TimedText::MXFReader::MXFReader((MXFReader *)local_398,in_RDX);
  ASDCP::TimedText::FrameBuffer::FrameBuffer
            ((FrameBuffer *)local_238,
             *(ui32_t *)((long)&fileReaderFactory[4]._vptr_IFileReaderFactory + 4));
  ASDCP::TimedText::TimedTextDescriptor::TimedTextDescriptor
            ((TimedTextDescriptor *)(local_238 + 0x58));
  local_360._M_p = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_358,(char *)fileReaderFactory[0xb]._vptr_IFileReaderFactory,local_148);
  AS_02::TimedText::MXFReader::OpenRead((string *)Options);
  if (local_358[0] != local_348) {
    operator_delete(local_358[0],local_348[0] + 1);
  }
  iVar11._0_1_ = Options->error_flag;
  iVar11._1_1_ = Options->key_flag;
  iVar11._2_1_ = Options->read_hmac;
  iVar11._3_1_ = Options->split_wav;
  if (-1 < iVar11) {
    plVar12 = (long *)AS_02::TimedText::MXFReader::OP1aHeader();
    MVar10 = ASDCP::DefaultCompositeDict();
    uVar13 = ASDCP::Dictionary::Type(MVar10);
    (**(code **)(*plVar12 + 0xa8))(local_358,plVar12,uVar13,&local_360);
    Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_358);
    Kumu::Result_t::~Result_t((Result_t *)local_358);
    if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01') {
      (**(code **)(*(long *)local_360._M_p + 0x88))(local_360._M_p,0);
    }
    iVar1._0_1_ = Options->error_flag;
    iVar1._1_1_ = Options->key_flag;
    iVar1._2_1_ = Options->read_hmac;
    iVar1._3_1_ = Options->split_wav;
    if (-1 < iVar1) {
      local_2f0 = (uint *)&local_2e0;
      local_2e8 = 0;
      local_2e0 = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_358,(char *)fileReaderFactory[6]._vptr_IFileReaderFactory,local_148
                );
      Kumu::PathDirname((string *)local_278,(char)local_358);
      if (local_358[0] != local_348) {
        operator_delete(local_358[0],local_348[0] + 1);
      }
      AS_02::TimedText::MXFReader::ReadTimedTextResource
                ((string *)local_358,(AESDecContext *)local_398,(HMACContext *)&local_2f0);
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_358);
      Kumu::Result_t::~Result_t((Result_t *)local_358);
      iVar2._0_1_ = Options->error_flag;
      iVar2._1_1_ = Options->key_flag;
      iVar2._2_1_ = Options->read_hmac;
      iVar2._3_1_ = Options->split_wav;
      if (-1 < iVar2) {
        AS_02::TimedText::MXFReader::FillTimedTextDescriptor((TimedTextDescriptor *)local_98);
        Kumu::Result_t::~Result_t(local_98);
        ASDCP::FrameBuffer::Capacity((uint)local_100);
        Kumu::Result_t::~Result_t(local_100);
        if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01') {
          ASDCP::TimedText::DescriptorDump
                    ((TimedTextDescriptor *)(local_238 + 0x58),(_IO_FILE *)0x0);
        }
      }
      iVar3._0_1_ = Options->error_flag;
      iVar3._1_1_ = Options->key_flag;
      iVar3._2_1_ = Options->read_hmac;
      iVar3._3_1_ = Options->split_wav;
      if ((-1 < iVar3) &&
         (*(char *)((long)&fileReaderFactory[1]._vptr_IFileReaderFactory + 4) == '\0')) {
        Kumu::FileWriter::FileWriter((FileWriter *)&local_2d0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_3b8,(char *)fileReaderFactory[6]._vptr_IFileReaderFactory,
                   (allocator<char> *)&local_380);
        Kumu::FileWriter::OpenWrite((string *)local_358);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_358);
        Kumu::Result_t::~Result_t((Result_t *)local_358);
        if (local_3b8[0] != local_3a8) {
          operator_delete(local_3b8[0],local_3a8[0] + 1);
        }
        iVar4._0_1_ = Options->error_flag;
        iVar4._1_1_ = Options->key_flag;
        iVar4._2_1_ = Options->read_hmac;
        iVar4._3_1_ = Options->split_wav;
        if (-1 < iVar4) {
          Kumu::FileWriter::Write((uchar *)local_358,(uint)&local_2d0,local_2f0);
          Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_358);
          Kumu::Result_t::~Result_t((Result_t *)local_358);
        }
        Kumu::FileWriter::~FileWriter((FileWriter *)&local_2d0);
      }
      if ((local_180._M_next != &local_180) &&
         (iVar5._0_1_ = Options->error_flag, iVar5._1_1_ = Options->key_flag,
         iVar5._2_1_ = Options->read_hmac, iVar5._3_1_ = Options->split_wav, -1 < iVar5)) {
        p_Var15 = local_180._M_next;
        do {
          local_2c8 = 1;
          local_2c7 = p_Var15[1]._M_next;
          p_Stack_2bf = p_Var15[1]._M_prev;
          local_2d0 = &PTR__IArchive_00112bb0;
          AS_02::TimedText::MXFReader::ReadAncillaryResource
                    ((UUID *)local_358,(FrameBuffer *)local_398,(AESDecContext *)&local_2d0,
                     (HMACContext *)local_238);
          Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_358);
          Kumu::Result_t::~Result_t((Result_t *)local_358);
          iVar6._0_1_ = Options->error_flag;
          iVar6._1_1_ = Options->key_flag;
          iVar6._2_1_ = Options->read_hmac;
          iVar6._3_1_ = Options->split_wav;
          if ((-1 < iVar6) &&
             (*(char *)((long)&fileReaderFactory[1]._vptr_IFileReaderFactory + 4) == '\0')) {
            Kumu::FileWriter::FileWriter((FileWriter *)&local_2d0);
            iVar11 = std::__cxx11::string::compare((char *)local_278);
            if (iVar11 == 0) {
              local_378 = 1;
              p_Var9 = p_Var15[1]._M_next;
              local_377 = SUB87(p_Var9,0);
              bStack_370 = (byte_t)((ulong)p_Var9 >> 0x38);
              abStack_36f = SUB87(p_Var15[1]._M_prev,0);
              bStack_368 = (byte_t)((ulong)p_Var15[1]._M_prev >> 0x38);
              local_380 = &PTR__IArchive_00112bb0;
              pcVar14 = (char *)Kumu::bin2UUIDhex(local_377,0x10,(char *)local_148,0x40);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_3b8,pcVar14,(allocator<char> *)local_298);
              Kumu::FileWriter::OpenWrite((string *)local_358);
              Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_358);
              Kumu::Result_t::~Result_t((Result_t *)local_358);
              lVar16 = local_3a8[0];
              plVar12 = local_3b8[0];
              if (local_3b8[0] != local_3a8) goto LAB_0010b128;
            }
            else {
              local_250 = 1;
              local_24f = p_Var15[1]._M_next;
              p_Stack_247 = p_Var15[1]._M_prev;
              local_258 = &PTR__IArchive_00112bb0;
              pcVar14 = (char *)Kumu::bin2UUIDhex((uchar *)&local_24f,0x10,(char *)local_148,0x40);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_298,pcVar14,&local_3b9);
              Kumu::PathJoin((string *)&local_380,(string *)local_278,(char)(string *)local_298);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_3b8,(char *)local_380,&local_3ba);
              Kumu::FileWriter::OpenWrite((string *)local_358);
              Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_358);
              Kumu::Result_t::~Result_t((Result_t *)local_358);
              if (local_3b8[0] != local_3a8) {
                operator_delete(local_3b8[0],local_3a8[0] + 1);
              }
              if (local_380 != (undefined **)&bStack_370) {
                operator_delete(local_380,CONCAT71(abStack_36f,bStack_370) + 1);
              }
              lVar16 = local_288[0];
              plVar12 = local_298[0];
              if (local_298[0] != local_288) {
LAB_0010b128:
                operator_delete(plVar12,lVar16 + 1);
              }
            }
            iVar7._0_1_ = Options->error_flag;
            iVar7._1_1_ = Options->key_flag;
            iVar7._2_1_ = Options->read_hmac;
            iVar7._3_1_ = Options->split_wav;
            if (-1 < iVar7) {
              Kumu::FileWriter::Write((uchar *)local_358,(uint)&local_2d0,(uint *)local_238._8_8_);
              Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_358);
              Kumu::Result_t::~Result_t((Result_t *)local_358);
            }
            if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01') {
              ASDCP::TimedText::FrameBuffer::Dump((_IO_FILE *)local_238,(uint)_stderr);
            }
            Kumu::FileWriter::~FileWriter((FileWriter *)&local_2d0);
          }
          p_Var15 = p_Var15->_M_next;
        } while ((p_Var15 != &local_180) &&
                (iVar8._0_1_ = Options->error_flag, iVar8._1_1_ = Options->key_flag,
                iVar8._2_1_ = Options->read_hmac, iVar8._3_1_ = Options->split_wav, -1 < iVar8));
      }
      if (local_278[0] != local_268) {
        operator_delete(local_278[0],local_268[0] + 1);
      }
      if (local_2f0 != (uint *)&local_2e0) {
        operator_delete(local_2f0,CONCAT71(uStack_2df,local_2e0) + 1);
      }
    }
  }
  if (local_168 != &local_158) {
    operator_delete(local_168,local_158._M_allocated_capacity + 1);
  }
  while (local_180._M_next != &local_180) {
    p_Var15 = (local_180._M_next)->_M_next;
    operator_delete(local_180._M_next,0x28);
    local_180._M_next = p_Var15;
  }
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0,local_190._M_allocated_capacity + 1);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0._M_allocated_capacity + 1);
  }
  ASDCP::TimedText::FrameBuffer::~FrameBuffer((FrameBuffer *)local_238);
  AS_02::TimedText::MXFReader::~MXFReader((MXFReader *)local_398);
  return Options;
}

Assistant:

Result_t
read_timed_text_file(CommandOptions& Options, const Kumu::IFileReaderFactory& fileReaderFactory)
{
  AESDecContext*     Context = 0;
  HMACContext*       HMAC = 0;
  AS_02::TimedText::MXFReader     Reader(fileReaderFactory);
  TimedText::FrameBuffer   FrameBuffer(Options.fb_size);
  //ASDCP::TimedText::FrameBuffer   FrameBuffer(Options.fb_size);
  AS_02::TimedText::TimedTextDescriptor TDesc;
  ASDCP::MXF::TimedTextDescriptor *tt_descriptor = 0;

  Result_t result = Reader.OpenRead(Options.input_filename);

  if ( ASDCP_SUCCESS(result) )
    {
      result = Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_TimedTextDescriptor),
						     reinterpret_cast<MXF::InterchangeObject**>(&tt_descriptor));
    if ( Options.verbose_flag ) {
    	tt_descriptor->Dump();
    }


  if ( ASDCP_FAILURE(result) )
    return result;

  std::string XMLDoc;
  std::string out_path = Kumu::PathDirname(Options.file_prefix);
  ui32_t write_count;
  char buf[64];
  TimedText::ResourceList_t::const_iterator ri;

  result = Reader.ReadTimedTextResource(XMLDoc);

  if ( ASDCP_SUCCESS(result) )
    {
      Reader.FillTimedTextDescriptor(TDesc);
      FrameBuffer.Capacity(Options.fb_size);

      if ( Options.verbose_flag )
	TimedText::DescriptorDump(TDesc);
    }

  if ( ASDCP_SUCCESS(result) && ( ! Options.no_write_flag ) )
    {
      Kumu::FileWriter Writer;
      result = Writer.OpenWrite(Options.file_prefix);

      if ( ASDCP_SUCCESS(result) )
	result = Writer.Write(reinterpret_cast<const byte_t*>(XMLDoc.c_str()), XMLDoc.size(), &write_count);
    }

  for ( ri = TDesc.ResourceList.begin() ; ri != TDesc.ResourceList.end() && ASDCP_SUCCESS(result); ri++ )
    {
      result = Reader.ReadAncillaryResource(ri->ResourceID, FrameBuffer, Context, HMAC);

      if ( ASDCP_SUCCESS(result) && ( ! Options.no_write_flag ) )
	{
	  Kumu::FileWriter Writer;
	  if (out_path != "") {
		  result = Writer.OpenWrite(Kumu::PathJoin(out_path, Kumu::UUID(ri->ResourceID).EncodeHex(buf, 64)).c_str());
	  } else {
		  // Workaround for a bug in Kumu::PathJoin
		  result = Writer.OpenWrite(Kumu::UUID(ri->ResourceID).EncodeHex(buf, 64));
	  }

	  if ( ASDCP_SUCCESS(result) )
	    result = Writer.Write(FrameBuffer.RoData(), FrameBuffer.Size(), &write_count);

	      if ( Options.verbose_flag )
		FrameBuffer.Dump(stderr, Options.fb_dump_size);
	}
    }
    }
  return result;
}